

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationRuleParser::parseResetAndPosition(CollationRuleParser *this,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *pUVar2;
  int8_t iVar3;
  UBool UVar4;
  char16_t cVar5;
  char16_t cVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint uVar10;
  UnicodeString str;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar7 = skipWhiteSpace(this,this->ruleIndex + 1);
    iVar3 = UnicodeString::doCompare(this->rules,iVar7,7,(UChar *)(anonymous_namespace)::BEFORE,0,7)
    ;
    uVar10 = 0xf;
    if (iVar3 == '\0') {
      pUVar2 = this->rules;
      sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar8 = (pUVar2->fUnion).fFields.fLength;
      }
      else {
        iVar8 = (int)sVar1 >> 5;
      }
      if (iVar7 + 7 < iVar8) {
        cVar5 = UnicodeString::doCharAt(pUVar2,iVar7 + 7);
        UVar4 = PatternProps::isWhiteSpace((uint)(ushort)cVar5);
        if (UVar4 != '\0') {
          iVar8 = skipWhiteSpace(this,iVar7 + 8);
          pUVar2 = this->rules;
          sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar9 = (pUVar2->fUnion).fFields.fLength;
          }
          else {
            iVar9 = (int)sVar1 >> 5;
          }
          if (((iVar8 + 1 < iVar9) &&
              (cVar5 = UnicodeString::doCharAt(pUVar2,iVar8), (ushort)(cVar5 + L'ￏ') < 3)) &&
             (cVar6 = UnicodeString::doCharAt(this->rules,iVar8 + 1), cVar6 == L']')) {
            uVar10 = (ushort)cVar5 - 0x31;
            iVar7 = skipWhiteSpace(this,iVar8 + 2);
          }
        }
      }
    }
    pUVar2 = this->rules;
    sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar8 = (pUVar2->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)sVar1 >> 5;
    }
    if (iVar7 < iVar8) {
      str.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003edbf0;
      str.fUnion.fStackFields.fLengthAndFlags = 2;
      cVar5 = UnicodeString::doCharAt(pUVar2,iVar7);
      if (cVar5 == L'[') {
        iVar7 = parseSpecialPosition(this,iVar7,&str,errorCode);
      }
      else {
        iVar7 = parseTailoringString(this,iVar7,&str,errorCode);
      }
      (*(this->sink->super_UObject)._vptr_UObject[3])
                (this->sink,(ulong)uVar10,&str,&this->errorReason,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        setErrorContext(this);
      }
      this->ruleIndex = iVar7;
      UnicodeString::~UnicodeString(&str);
      return uVar10;
    }
    setParseError(this,"reset without position",errorCode);
  }
  return -1;
}

Assistant:

int32_t
CollationRuleParser::parseResetAndPosition(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return UCOL_DEFAULT; }
    int32_t i = skipWhiteSpace(ruleIndex + 1);
    int32_t j;
    UChar c;
    int32_t resetStrength;
    if(rules->compare(i, BEFORE_LENGTH, BEFORE, 0, BEFORE_LENGTH) == 0 &&
            (j = i + BEFORE_LENGTH) < rules->length() &&
            PatternProps::isWhiteSpace(rules->charAt(j)) &&
            ((j = skipWhiteSpace(j + 1)) + 1) < rules->length() &&
            0x31 <= (c = rules->charAt(j)) && c <= 0x33 &&
            rules->charAt(j + 1) == 0x5d) {
        // &[before n] with n=1 or 2 or 3
        resetStrength = UCOL_PRIMARY + (c - 0x31);
        i = skipWhiteSpace(j + 2);
    } else {
        resetStrength = UCOL_IDENTICAL;
    }
    if(i >= rules->length()) {
        setParseError("reset without position", errorCode);
        return UCOL_DEFAULT;
    }
    UnicodeString str;
    if(rules->charAt(i) == 0x5b) {  // '['
        i = parseSpecialPosition(i, str, errorCode);
    } else {
        i = parseTailoringString(i, str, errorCode);
    }
    sink->addReset(resetStrength, str, errorReason, errorCode);
    if(U_FAILURE(errorCode)) { setErrorContext(); }
    ruleIndex = i;
    return resetStrength;
}